

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase
          (RaceSuccessfulPromiseNodeBase *this,
          Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *promises,
          ExceptionOrValue *output,SourceLocation location)

{
  size_t count;
  ulong uVar1;
  ulong uVar2;
  ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch> builder;
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> local_48;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_006730e0;
  this->output = output;
  this->countLeft = (uint)promises->size_;
  (this->onReadyEvent).event = (Event *)0x0;
  this->armed = false;
  (this->branches).ptr = (Branch *)0x0;
  (this->branches).size_ = 0;
  (this->branches).disposer = (ArrayDisposer *)0x0;
  count = promises->size_;
  builder.pos = HeapArrayDisposer::
                allocateUninitialized<kj::_::RaceSuccessfulPromiseNodeBase::Branch>(count);
  builder.endPtr = builder.pos + count;
  builder.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  uVar1 = promises->size_;
  builder.ptr = builder.pos;
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    ctor<kj::_::RaceSuccessfulPromiseNodeBase::Branch,kj::_::RaceSuccessfulPromiseNodeBase&,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
              (builder.pos,this,promises->ptr + (uVar2 & 0xffffffff),&location);
    builder.pos = builder.pos + 1;
  }
  local_48.size_ = ((long)builder.pos - (long)builder.ptr) / 0x50;
  local_48.ptr = builder.ptr;
  local_48.disposer = builder.disposer;
  builder.ptr = (Branch *)0x0;
  builder.pos = (RemoveConst<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)0x0;
  builder.endPtr = (Branch *)0x0;
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::operator=(&this->branches,&local_48);
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::~Array(&local_48);
  if ((this->branches).size_ == 0) {
    PromiseNode::OnReadyEvent::arm(&this->onReadyEvent);
  }
  ArrayBuilder<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::dispose(&builder);
  return;
}

Assistant:

RaceSuccessfulPromiseNodeBase::RaceSuccessfulPromiseNodeBase(
    Array<OwnPromiseNode> promises, ExceptionOrValue &output,
    SourceLocation location)
    : output(output), countLeft(promises.size()) {
  // Make the branches.
  auto builder = heapArrayBuilder<Branch>(promises.size());
  for (uint i : indices(promises)) {
    builder.add(*this, kj::mv(promises[i]), location);
  }
  branches = builder.finish();

  if (branches.size() == 0) {
    onReadyEvent.arm();
  }
}